

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zetMetricGet
          (zet_metric_group_handle_t hMetricGroup,uint32_t *pCount,zet_metric_handle_t *phMetrics)

{
  zet_metric_handle_t p_Var1;
  bool bVar2;
  ulong local_38;
  size_t i;
  zet_pfnMetricGet_t pfnGet;
  ze_result_t result;
  zet_metric_handle_t *phMetrics_local;
  uint32_t *pCount_local;
  zet_metric_group_handle_t hMetricGroup_local;
  
  pfnGet._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c860 == (code *)0x0) {
    local_38 = 0;
    while( true ) {
      bVar2 = false;
      if (phMetrics != (zet_metric_handle_t *)0x0) {
        bVar2 = local_38 < *pCount;
      }
      if (!bVar2) break;
      p_Var1 = (zet_metric_handle_t)context_t::get((context_t *)&context);
      phMetrics[local_38] = p_Var1;
      local_38 = local_38 + 1;
    }
  }
  else {
    pfnGet._4_4_ = (*DAT_0011c860)(hMetricGroup,pCount,phMetrics);
  }
  return pfnGet._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricGet(
        zet_metric_group_handle_t hMetricGroup,         ///< [in] handle of the metric group
        uint32_t* pCount,                               ///< [in,out] pointer to the number of metrics.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of metrics available.
                                                        ///< if count is greater than the number of metrics available, then the
                                                        ///< driver shall update the value with the correct number of metrics available.
        zet_metric_handle_t* phMetrics                  ///< [in,out][optional][range(0, *pCount)] array of handle of metrics.
                                                        ///< if count is less than the number of metrics available, then driver
                                                        ///< shall only retrieve that number of metrics.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGet = context.zetDdiTable.Metric.pfnGet;
        if( nullptr != pfnGet )
        {
            result = pfnGet( hMetricGroup, pCount, phMetrics );
        }
        else
        {
            // generic implementation
            for( size_t i = 0; ( nullptr != phMetrics ) && ( i < *pCount ); ++i )
                phMetrics[ i ] = reinterpret_cast<zet_metric_handle_t>( context.get() );

        }

        return result;
    }